

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsArrCol3f
          (X3DImporter *this,int pAttrIdx,vector<aiColor3D,_std::allocator<aiColor3D>_> *pValue)

{
  size_t sVar1;
  bool bVar2;
  size_type __n;
  reference __x;
  _Self local_58;
  _Self local_50;
  iterator it;
  undefined1 local_38 [8];
  list<aiColor3D,_std::allocator<aiColor3D>_> tlist;
  vector<aiColor3D,_std::allocator<aiColor3D>_> *pValue_local;
  int pAttrIdx_local;
  X3DImporter *this_local;
  
  tlist.super__List_base<aiColor3D,_std::allocator<aiColor3D>_>._M_impl._M_node._M_size =
       (size_t)pValue;
  std::__cxx11::list<aiColor3D,_std::allocator<aiColor3D>_>::list
            ((list<aiColor3D,_std::allocator<aiColor3D>_> *)local_38);
  XML_ReadNode_GetAttrVal_AsListCol3f
            (this,pAttrIdx,(list<aiColor3D,_std::allocator<aiColor3D>_> *)local_38);
  bVar2 = std::__cxx11::list<aiColor3D,_std::allocator<aiColor3D>_>::empty
                    ((list<aiColor3D,_std::allocator<aiColor3D>_> *)local_38);
  sVar1 = tlist.super__List_base<aiColor3D,_std::allocator<aiColor3D>_>._M_impl._M_node._M_size;
  if (!bVar2) {
    __n = std::__cxx11::list<aiColor3D,_std::allocator<aiColor3D>_>::size
                    ((list<aiColor3D,_std::allocator<aiColor3D>_> *)local_38);
    std::vector<aiColor3D,_std::allocator<aiColor3D>_>::reserve
              ((vector<aiColor3D,_std::allocator<aiColor3D>_> *)sVar1,__n);
    local_50._M_node =
         (_List_node_base *)
         std::__cxx11::list<aiColor3D,_std::allocator<aiColor3D>_>::begin
                   ((list<aiColor3D,_std::allocator<aiColor3D>_> *)local_38);
    while( true ) {
      local_58._M_node =
           (_List_node_base *)
           std::__cxx11::list<aiColor3D,_std::allocator<aiColor3D>_>::end
                     ((list<aiColor3D,_std::allocator<aiColor3D>_> *)local_38);
      bVar2 = std::operator!=(&local_50,&local_58);
      sVar1 = tlist.super__List_base<aiColor3D,_std::allocator<aiColor3D>_>._M_impl._M_node._M_size;
      if (!bVar2) break;
      __x = std::_List_iterator<aiColor3D>::operator*(&local_50);
      std::vector<aiColor3D,_std::allocator<aiColor3D>_>::push_back
                ((vector<aiColor3D,_std::allocator<aiColor3D>_> *)sVar1,__x);
      std::_List_iterator<aiColor3D>::operator++(&local_50);
    }
  }
  std::__cxx11::list<aiColor3D,_std::allocator<aiColor3D>_>::~list
            ((list<aiColor3D,_std::allocator<aiColor3D>_> *)local_38);
  return;
}

Assistant:

void X3DImporter::XML_ReadNode_GetAttrVal_AsArrCol3f(const int pAttrIdx, std::vector<aiColor3D>& pValue)
{
    std::list<aiColor3D> tlist;

	XML_ReadNode_GetAttrVal_AsListCol3f(pAttrIdx, tlist);// read as list
	// and copy to array
	if(!tlist.empty())
	{
		pValue.reserve(tlist.size());
		for(std::list<aiColor3D>::iterator it = tlist.begin(); it != tlist.end(); ++it) pValue.push_back(*it);
	}
}